

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

Bac_ObjType_t Bac_NameToType(char *pName)

{
  char *__s;
  int iVar1;
  size_t __n;
  long lVar2;
  
  iVar1 = strncmp(pName,"ABC_",4);
  if (iVar1 == 0) {
    lVar2 = 0x20;
    do {
      __s = *(char **)((long)&s_Types[0].Type + lVar2);
      __n = strlen(__s);
      iVar1 = strncmp(pName + 4,__s,__n);
      if (iVar1 == 0) {
        return *(Bac_ObjType_t *)((long)&DAT_00b881e8 + lVar2);
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x6e0);
  }
  return BAC_OBJ_NONE;
}

Assistant:

Bac_ObjType_t Bac_NameToType( char * pName )
{
    int i;
    if ( strncmp(pName, s_Pref, strlen(s_Pref)) )
        return BAC_OBJ_NONE;
    pName += strlen(s_Pref);
    for ( i = 1; i < BAC_BOX_UNKNOWN; i++ )
        if ( !strncmp(pName, s_Types[i].pName, strlen(s_Types[i].pName)) )
            return s_Types[i].Type;
    return BAC_OBJ_NONE;
}